

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Filter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int fVerbose;
  int c;
  int fUseRiDrivers;
  int fFlopsWith;
  int fFlopsOnly;
  char *pFileName2;
  char *pFileName1;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fUseRiDrivers = 0;
  c = 0;
  fVerbose = 0;
  bVar1 = false;
  Extra_UtilGetoptReset();
LAB_002527f6:
  iVar2 = Extra_UtilGetopt(argc,argv,"fgivh");
  if (iVar2 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Srm2(): There is no AIG.\n");
      pAbc_local._4_4_ = 1;
    }
    else if ((pAbc->pGia->pReprs == (Gia_Rpr_t *)0x0) || (pAbc->pGia->pNexts == (int *)0x0)) {
      Abc_Print(-1,"Equivalences are not defined.\n");
      pAbc_local._4_4_ = 0;
    }
    else if ((argc == globalUtilOptind) || (argc == globalUtilOptind + 2)) {
      if (fUseRiDrivers != c) {
        Gia_ManFilterEquivsUsingLatches(pAbc->pGia,fUseRiDrivers,c,fVerbose);
      }
      if ((argc == globalUtilOptind + 2) &&
         (iVar2 = Gia_ManFilterEquivsUsingParts
                            (pAbc->pGia,argv[globalUtilOptind],argv[globalUtilOptind + 1]),
         iVar2 == 0)) {
        Abc_Print(-1,"Filtering equivalences using PartA and PartB has failed.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        pAbc_local._4_4_ = 0;
      }
    }
    else {
      Abc_Print(-1,"Abc_CommandAbc9Srm2(): Expecting two file names on the command line.\n");
      pAbc_local._4_4_ = 1;
    }
    return pAbc_local._4_4_;
  }
  switch(iVar2) {
  case 0x66:
    fUseRiDrivers = fUseRiDrivers ^ 1;
    goto LAB_002527f6;
  case 0x67:
    c = c ^ 1;
    goto LAB_002527f6;
  case 0x68:
    break;
  case 0x69:
    fVerbose = fVerbose ^ 1;
    goto LAB_002527f6;
  default:
    break;
  case 0x76:
    goto switchD_00252834_caseD_76;
  }
  Abc_Print(-2,"usage: &filter [-fgivh] <PartA_FileName> <PartB_FileName>\n");
  Abc_Print(-2,"\t         performs filtering of equivalence classes\n");
  Abc_Print(-2,"\t         (if Parts A/B are given, removes classes composed of one part)\n");
  pcVar3 = "no";
  if (fUseRiDrivers != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-f     : toggle removing all elements except flops [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (c != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-g     : toggle removing classes without flops [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (fVerbose != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-i     : toggle using flop inputs instead of flop outputs [default = %s]\n",pcVar3
           );
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_00252834_caseD_76:
  bVar1 = (bool)(bVar1 ^ 1);
  goto LAB_002527f6;
}

Assistant:

int Abc_CommandAbc9Filter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileName1 = NULL, * pFileName2 = NULL;
    int fFlopsOnly = 0, fFlopsWith = 0, fUseRiDrivers = 0;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "fgivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fFlopsOnly ^= 1;
            break;
        case 'g':
            fFlopsWith ^= 1;
            break;
        case 'i':
            fUseRiDrivers ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Srm2(): There is no AIG.\n" );
        return 1;
    }
    if ( pAbc->pGia->pReprs == NULL || pAbc->pGia->pNexts == NULL )
    {
        Abc_Print( -1, "Equivalences are not defined.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind && argc != globalUtilOptind + 2 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Srm2(): Expecting two file names on the command line.\n" );
        return 1;
    }
    // filter using one of the choices
    if ( fFlopsOnly ^ fFlopsWith )
        Gia_ManFilterEquivsUsingLatches( pAbc->pGia, fFlopsOnly, fFlopsWith, fUseRiDrivers );
    // get the input file name
    if ( argc == globalUtilOptind + 2 )
    {
        pFileName1 = argv[globalUtilOptind];
        pFileName2 = argv[globalUtilOptind+1];
        if ( !Gia_ManFilterEquivsUsingParts( pAbc->pGia, pFileName1, pFileName2 ) )
        {
            Abc_Print( -1, "Filtering equivalences using PartA and PartB has failed.\n" );
            return 1;
        }
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &filter [-fgivh] <PartA_FileName> <PartB_FileName>\n" );
    Abc_Print( -2, "\t         performs filtering of equivalence classes\n" );
    Abc_Print( -2, "\t         (if Parts A/B are given, removes classes composed of one part)\n" );
    Abc_Print( -2, "\t-f     : toggle removing all elements except flops [default = %s]\n", fFlopsOnly? "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle removing classes without flops [default = %s]\n", fFlopsWith? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggle using flop inputs instead of flop outputs [default = %s]\n", fUseRiDrivers? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}